

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool duckdb_je_arena_dirty_decay_ms_default_set(ssize_t decay_ms)

{
  _Bool _Var1;
  
  _Var1 = duckdb_je_decay_ms_valid(decay_ms);
  if (_Var1) {
    dirty_decay_ms_default.repr = decay_ms;
  }
  return !_Var1;
}

Assistant:

bool
arena_dirty_decay_ms_default_set(ssize_t decay_ms) {
	if (!decay_ms_valid(decay_ms)) {
		return true;
	}
	atomic_store_zd(&dirty_decay_ms_default, decay_ms, ATOMIC_RELAXED);
	return false;
}